

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.c
# Opt level: O3

void do_flag(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  byte *argument_00;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar8;
  char *argument_01;
  int iVar9;
  long lVar10;
  long lVar11;
  flag_type *flag_table;
  long *plVar12;
  long lVar13;
  double __x;
  double dVar14;
  double dVar15;
  char arg3 [4608];
  char arg1 [4608];
  char word [4608];
  char arg2 [4608];
  long *local_4858;
  char local_4838 [4608];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar7 = one_argument(argument,local_3638);
  pcVar7 = one_argument(pcVar7,local_1238);
  argument_00 = (byte *)one_argument(pcVar7,local_4838);
  bVar2 = *argument_00;
  if (((ulong)bVar2 < 0x3e) && ((0x2000280000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
    argument_00 = (byte *)one_argument((char *)argument_00,local_2438);
  }
  if (local_3638[0] != '\0') {
    if (local_1238[0] == '\0') {
      pcVar7 = "What do you wish to set flags on?\n\r";
      goto LAB_0029b46c;
    }
    if (local_4838[0] == '\0') {
      pcVar7 = "You need to specify a flag to set.\n\r";
      goto LAB_0029b46c;
    }
    if (*argument_00 == 0) {
      pcVar7 = "Which flags do you wish to change?\n\r";
      goto LAB_0029b46c;
    }
    bVar5 = str_prefix(local_3638,"mob");
    if ((!bVar5) || (bVar5 = str_prefix(local_3638,"char"), !bVar5)) {
      ch_00 = get_char_world(ch,local_1238);
      if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar7 = "You can\'t find them.\n\r";
        goto LAB_0029b46c;
      }
      bVar5 = str_prefix(local_4838,"act");
      if (!bVar5) {
        bVar5 = is_npc(ch_00);
        if (bVar5) {
          local_4858 = ch_00->act;
          flag_table = act_flags;
          goto LAB_0029b4d5;
        }
        pcVar7 = "Use plr for PCs.\n\r";
        goto LAB_0029b46c;
      }
      bVar5 = str_prefix(local_4838,"plr");
      if (!bVar5) {
        bVar5 = is_npc(ch_00);
        if (bVar5) {
          pcVar7 = "Use act for NPCs.\n\r";
          goto LAB_0029b46c;
        }
        local_4858 = ch_00->act;
        flag_table = plr_flags;
        goto LAB_0029b4d5;
      }
      bVar5 = str_prefix(local_4838,"aff");
      if (!bVar5) {
        local_4858 = ch_00->affected_by;
        flag_table = affect_flags;
        goto LAB_0029b4d5;
      }
      bVar5 = str_prefix(local_4838,"immunity");
      if (bVar5) {
        bVar5 = str_prefix(local_4838,"resist");
        if (bVar5) {
          bVar5 = str_prefix(local_4838,"vuln");
          if (bVar5) {
            bVar5 = str_prefix(local_4838,"off");
            if (!bVar5) {
              bVar5 = is_npc(ch_00);
              if (bVar5) {
                local_4858 = ch_00->off_flags;
                flag_table = off_flags;
                goto LAB_0029b4d5;
              }
              pcVar7 = "OFF can\'t be set on PCs.\n\r";
              goto LAB_0029b46c;
            }
            bVar5 = str_prefix(local_4838,"form");
            if (!bVar5) {
              bVar5 = is_npc(ch_00);
              if (bVar5) {
                local_4858 = ch_00->form;
                flag_table = form_flags;
                goto LAB_0029b4d5;
              }
              pcVar7 = "Form can\'t be set on PCs.\n\r";
              goto LAB_0029b46c;
            }
            bVar5 = str_prefix(local_4838,"parts");
            if (!bVar5) {
              bVar5 = is_npc(ch_00);
              if (bVar5) {
                local_4858 = ch_00->parts;
                flag_table = part_flags;
                goto LAB_0029b4d5;
              }
              pcVar7 = "Parts can\'t be set on PCs.\n\r";
              goto LAB_0029b46c;
            }
            bVar5 = str_prefix(local_4838,"comm");
            if (!bVar5) {
              bVar5 = is_npc(ch_00);
              if (!bVar5) {
                local_4858 = ch_00->comm;
                flag_table = comm_flags;
                goto LAB_0029b4d5;
              }
              pcVar7 = "Comm can\'t be set on NPCs.\n\r";
              goto LAB_0029b46c;
            }
            goto LAB_0029b413;
          }
          local_4858 = ch_00->vuln_flags;
        }
        else {
          local_4858 = ch_00->res_flags;
        }
      }
      else {
        local_4858 = ch_00->imm_flags;
      }
      flag_table = imm_flags;
LAB_0029b4d5:
      argument_01 = one_argument((char *)argument_00,local_2438);
      if (local_2438[0] == '\0') {
        lVar13 = -99;
      }
      else {
        pcVar7 = "That flag doesn\'t exist!\n\r";
        do {
          iVar6 = flag_lookup(local_2438,flag_table);
          if (iVar6 == -99) goto LAB_0029b46c;
          argument_01 = one_argument(argument_01,local_2438);
        } while (local_2438[0] != '\0');
        lVar13 = (long)iVar6;
      }
      if (flag_table->name == (char *)0x0) {
        return;
      }
      lVar10 = lVar13 + 0x1f;
      if (-1 < lVar13) {
        lVar10 = lVar13;
      }
      __x = (double)(lVar13 % 0x20);
      plVar12 = &flag_table->bit;
      do {
        iVar6 = get_trust(ch);
        if (((iVar6 == 0x3c) || (*(bool *)(plVar12 + 1) == true)) && (*plVar12 == lVar13)) {
          if (bVar2 == 0x3d) {
LAB_0029b5b6:
            dVar14 = exp2(__x);
            iVar6 = (int)*plVar12;
            iVar9 = iVar6 + 0x1f;
            if (-1 < iVar6) {
              iVar9 = iVar6;
            }
            local_4858[iVar9 >> 5] = local_4858[iVar9 >> 5] | (long)dVar14;
            pcVar7 = "You set that flag.\n\r";
          }
          else if (bVar2 == 0x2d) {
            dVar14 = exp2(__x);
            lVar4 = *plVar12;
            lVar11 = lVar4 + 0x1f;
            if (-1 < lVar4) {
              lVar11 = lVar4;
            }
            local_4858[lVar11 >> 5] = local_4858[lVar11 >> 5] & ~(long)dVar14;
            pcVar7 = "You removed that flag.\n\r";
          }
          else {
            if (bVar2 == 0x2b) goto LAB_0029b5b6;
            uVar3 = local_4858[lVar10 >> 5];
            dVar14 = exp2(__x);
            dVar15 = exp2((double)(*plVar12 % 0x20));
            if ((uVar3 & (long)dVar14) == 0) {
              iVar6 = (int)*plVar12;
              iVar9 = iVar6 + 0x1f;
              if (-1 < iVar6) {
                iVar9 = iVar6;
              }
              local_4858[iVar9 >> 5] = local_4858[iVar9 >> 5] | (long)dVar15;
              pcVar7 = "You set that flag.\n\r";
            }
            else {
              lVar4 = *plVar12;
              lVar11 = lVar4 + 0x1f;
              if (-1 < lVar4) {
                lVar11 = lVar4;
              }
              local_4858[lVar11 >> 5] = local_4858[lVar11 >> 5] & ~(long)dVar15;
              pcVar7 = "You removed that flag.\n\r";
            }
          }
          send_to_char(pcVar7,ch);
        }
        plVar1 = plVar12 + 2;
        plVar12 = plVar12 + 3;
        if (*plVar1 == 0) {
          return;
        }
      } while( true );
    }
    bVar5 = str_prefix(local_3638,"obj");
    if (!bVar5) {
      pOVar8 = get_obj_world(ch,local_1238);
      if (pOVar8 == (OBJ_DATA *)0x0) {
        pcVar7 = "Nothing like that anywhere.\n\r";
        goto LAB_0029b46c;
      }
      bVar5 = str_prefix(local_4838,"wear");
      if (!bVar5) {
        local_4858 = pOVar8->wear_flags;
        flag_table = wear_flags;
        goto LAB_0029b4d5;
      }
      bVar5 = str_prefix(local_4838,"extra");
      if (!bVar5) {
        local_4858 = pOVar8->extra_flags;
        flag_table = extra_flags;
        goto LAB_0029b4d5;
      }
LAB_0029b413:
      pcVar7 = "That\'s not an acceptable flag.\n\r";
      goto LAB_0029b46c;
    }
  }
  send_to_char("Syntax:\n\r",ch);
  send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r",ch);
  send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r",ch);
  send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r",ch);
  send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r",ch);
  send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r",ch);
  send_to_char("  obj flags:  wear,extra\n\r",ch);
  send_to_char("  +: add flag, -: remove flag, = set equal to\n\r",ch);
  pcVar7 = "  otherwise flag toggles the flags listed.\n\r";
LAB_0029b46c:
  send_to_char(pcVar7,ch);
  return;
}

Assistant:

void do_flag(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH], arg3[MAX_INPUT_LENGTH];
	char word[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	long *flag = 0;
	long pos, pos2 = NO_FLAG;
	char type;
	const struct flag_type *flag_table;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	type = argument[0];

	if (type == '=' || type == '-' || type == '+')
		argument = one_argument(argument, word);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		send_to_char("What do you wish to set flags on?\n\r", ch);
		return;
	}

	if (arg3[0] == '\0')
	{
		send_to_char("You need to specify a flag to set.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Which flags do you wish to change?\n\r", ch);
		return;
	}

	if (!str_prefix(arg1, "mob") || !str_prefix(arg1, "char"))
	{
		victim = get_char_world(ch, arg2);
		if (victim == nullptr)
		{
			send_to_char("You can't find them.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "act"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Use plr for PCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = act_flags;
		}
		else if (!str_prefix(arg3, "plr"))
		{
			if (is_npc(victim))
			{
				send_to_char("Use act for NPCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = plr_flags;
		}
		else if (!str_prefix(arg3, "aff"))
		{
			flag = &victim->affected_by[0];
			flag_table = affect_flags;
		}
		else if (!str_prefix(arg3, "immunity"))
		{
			flag = &victim->imm_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "resist"))
		{
			flag = &victim->res_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "vuln"))
		{
			flag = &victim->vuln_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "off"))
		{
			if (!is_npc(victim))
			{
				send_to_char("OFF can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->off_flags[0];
			flag_table = off_flags;
		}
		else if (!str_prefix(arg3, "form"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Form can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->form[0];
			flag_table = form_flags;
		}
		else if (!str_prefix(arg3, "parts"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Parts can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->parts[0];
			flag_table = part_flags;
		}
		else if (!str_prefix(arg3, "comm"))
		{
			if (is_npc(victim))
			{
				send_to_char("Comm can't be set on NPCs.\n\r", ch);
				return;
			}
			flag = &victim->comm[0];
			flag_table = comm_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg1, "obj"))
	{
		if ((obj = get_obj_world(ch, arg2)) == nullptr)
		{
			send_to_char("Nothing like that anywhere.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "wear"))
		{
			flag = &obj->wear_flags[0];
			flag_table = wear_flags;
		}
		else if (!str_prefix(arg3, "extra"))
		{
			flag = &obj->extra_flags[0];
			flag_table = extra_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	/* mark the words */
	for (;;)
	{
		argument = one_argument(argument, word);

		if (word[0] == '\0')
			break;

		pos2 = flag_lookup(word, flag_table);

		if (pos2 == NO_FLAG)
		{
			send_to_char("That flag doesn't exist!\n\r", ch);
			return;
		}
	}

	for (pos = 0; flag_table[pos].name != nullptr; pos++)
	{
		if ((get_trust(ch) == MAX_LEVEL || flag_table[pos].settable) && flag_table[pos].bit == pos2)
		{
			switch (type)
			{
				case '=':
				case '+':
					SET_BIT(flag, flag_table[pos].bit);
					send_to_char("You set that flag.\n\r", ch);
					break;
				case '-':
					REMOVE_BIT(flag, flag_table[pos].bit);
					send_to_char("You removed that flag.\n\r", ch);
					break;
				default:
					if (IS_SET(flag, flag_table[pos].bit))
					{
						REMOVE_BIT(flag, flag_table[pos].bit);
						send_to_char("You removed that flag.\n\r", ch);
					}
					else
					{
						SET_BIT(flag, flag_table[pos].bit);
						send_to_char("You set that flag.\n\r", ch);
					}
			}
		}
		else
		{
			continue;
		}
	}
}